

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# time.cc
# Opt level: O2

string * util::stringTime_abi_cxx11_(void)

{
  int iVar1;
  tm *__tp;
  size_t sVar2;
  runtime_error *prVar3;
  string *in_RDI;
  int *in_R9;
  char local_dc [4];
  string local_d8;
  timespec ts;
  array<char,_128UL> tsbuf;
  
  iVar1 = clock_gettime(0,(timespec *)&ts);
  if (iVar1 < 0) {
    prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
    local_d8._M_dataplus._M_p._0_4_ = 0xc;
    str<char[31],char[90],char[2],int>
              ((string *)&tsbuf,(util *)"Assertion `rv >= 0` failed at ",
               (char (*) [31])
               "/workspace/llm4binary/github/license_all_cmakelists_25/nqbit[P]goestools/src/util/time.cc"
               ,(char (*) [90])0x16a222,(char (*) [2])&local_d8,in_R9);
    std::runtime_error::runtime_error(prVar3,(string *)&tsbuf);
    __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  __tp = gmtime(&ts.tv_sec);
  sVar2 = strftime(tsbuf._M_elems,0x80,"%Y-%m-%dT%H:%M:%S.",__tp);
  iVar1 = snprintf(tsbuf._M_elems + sVar2,0x80 - sVar2,"%03ldZ",ts.tv_nsec / 1000000);
  if ((long)iVar1 + sVar2 < 0x80) {
    (in_RDI->_M_dataplus)._M_p = (pointer)&in_RDI->field_2;
    std::__cxx11::string::_M_construct<char_const*>();
    return in_RDI;
  }
  prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
  local_dc[0] = '\x12';
  local_dc[1] = '\0';
  local_dc[2] = '\0';
  local_dc[3] = '\0';
  str<char[42],char[90],char[2],int>
            (&local_d8,(util *)"Assertion `len < tsbuf.size()` failed at ",
             (char (*) [42])
             "/workspace/llm4binary/github/license_all_cmakelists_25/nqbit[P]goestools/src/util/time.cc"
             ,(char (*) [90])0x16a222,(char (*) [2])local_dc,in_R9);
  std::runtime_error::runtime_error(prVar3,(string *)&local_d8);
  __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

std::string stringTime() {
  struct timespec ts;
  auto rv = clock_gettime(CLOCK_REALTIME, &ts);
  ASSERT(rv >= 0);
  std::array<char, 128> tsbuf;
  auto len = strftime(
      tsbuf.data(), tsbuf.size(), "%Y-%m-%dT%H:%M:%S.", gmtime(&ts.tv_sec));
  len += snprintf(
      tsbuf.data() + len, tsbuf.size() - len, "%03ldZ", ts.tv_nsec / 1000000);
  ASSERT(len < tsbuf.size());
  return std::string(tsbuf.data(), len);
}